

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_mt_test.c
# Opt level: O2

int main(int argc,char **argv)

{
  RK_S32 RVar1;
  char *pcVar2;
  MpiDecTestCmd cmd_ctx;
  
  memset(&cmd_ctx,0,0x260);
  cmd_ctx.timeout = -1;
  RVar1 = mpi_dec_test_cmd_init(&cmd_ctx,argc,argv);
  if (RVar1 == 0) {
    mpi_dec_test_cmd_options(&cmd_ctx);
    if (cmd_ctx.type == MPP_VIDEO_CodingMJPEG) {
      pcVar2 = "mpi_dec_mt_test not support mjpeg yet\n";
    }
    else {
      RVar1 = mt_dec_decode(&cmd_ctx);
      if (RVar1 != 0) {
        _mpp_log_l(2,"mpi_dec_mt_test","test failed ret %d\n",0,RVar1);
        goto LAB_00105243;
      }
      pcVar2 = "test success\n";
    }
    RVar1 = 0;
    _mpp_log_l(4,"mpi_dec_mt_test",pcVar2,0);
  }
LAB_00105243:
  mpi_dec_test_cmd_deinit(&cmd_ctx);
  return RVar1;
}

Assistant:

int main(int argc, char **argv)
{
    RK_S32 ret = 0;
    MpiDecTestCmd  cmd_ctx;
    MpiDecTestCmd* cmd = &cmd_ctx;

    memset((void*)cmd, 0, sizeof(*cmd));
    // default use block mode
    cmd->timeout = -1;

    // parse the cmd option
    ret = mpi_dec_test_cmd_init(cmd, argc, argv);
    if (ret)
        goto RET;

    mpi_dec_test_cmd_options(cmd);

    if (cmd->type == MPP_VIDEO_CodingMJPEG) {
        mpp_log("mpi_dec_mt_test not support mjpeg yet\n");
        goto RET;
    }

    ret = mt_dec_decode(cmd);
    if (MPP_OK == ret)
        mpp_log("test success\n");
    else
        mpp_err("test failed ret %d\n", ret);

RET:
    mpi_dec_test_cmd_deinit(cmd);

    return ret;
}